

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::ReleaseSnapshot(DBImpl *this,Snapshot *snapshot)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    SnapshotList::Delete(&this->snapshots_,(SnapshotImpl *)snapshot);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::ReleaseSnapshot(const Snapshot* snapshot) {
  MutexLock l(&mutex_);
  snapshots_.Delete(static_cast<const SnapshotImpl*>(snapshot));
}